

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void tcpnodelay(connectdata *conn,curl_socket_t sockfd)

{
  Curl_easy *data_00;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char local_a8 [8];
  char buffer [128];
  int level;
  curl_socklen_t onoff;
  Curl_easy *data;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  buffer[0x7c] = '\x01';
  buffer[0x7d] = '\0';
  buffer[0x7e] = '\0';
  buffer[0x7f] = '\0';
  buffer[0x78] = '\x06';
  buffer[0x79] = '\0';
  buffer[0x7a] = '\0';
  buffer[0x7b] = '\0';
  iVar1 = setsockopt(sockfd,6,1,buffer + 0x7c,4);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = Curl_strerror(*piVar2,local_a8,0x80);
    Curl_infof(data_00,"Could not set TCP_NODELAY: %s\n",pcVar3);
  }
  else {
    Curl_infof(data_00,"TCP_NODELAY set\n");
  }
  return;
}

Assistant:

static void tcpnodelay(struct connectdata *conn, curl_socket_t sockfd)
{
#if defined(TCP_NODELAY)
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
  struct Curl_easy *data = conn->data;
#endif
  curl_socklen_t onoff = (curl_socklen_t) 1;
  int level = IPPROTO_TCP;
  char buffer[STRERROR_LEN];

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void) conn;
#endif

  if(setsockopt(sockfd, level, TCP_NODELAY, (void *)&onoff,
                sizeof(onoff)) < 0)
    infof(data, "Could not set TCP_NODELAY: %s\n",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
  else
    infof(data, "TCP_NODELAY set\n");
#else
  (void)conn;
  (void)sockfd;
#endif
}